

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::EnsureDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  bool bVar1;
  cmGlobalNinjaGenerator *this_00;
  char *pcVar2;
  string fullPath;
  allocator local_39;
  string local_38;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
  if (bVar1) {
    cmsys::SystemTools::MakeDirectory((path->_M_dataplus)._M_p);
    return;
  }
  this_00 = GetGlobalGenerator(this);
  pcVar2 = cmake::GetHomeOutputDirectory
                     ((this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                     );
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
  cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(this_00,&local_38);
  std::__cxx11::string::append((string *)&local_38);
  cmsys::SystemTools::MakeDirectory(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureDirectoryExists(
  const std::string& path) const
{
  if (cmSystemTools::FileIsFullPath(path.c_str())) {
    cmSystemTools::MakeDirectory(path.c_str());
  } else {
    cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
    std::string fullPath =
      std::string(gg->GetCMakeInstance()->GetHomeOutputDirectory());
    // Also ensures their is a trailing slash.
    gg->StripNinjaOutputPathPrefixAsSuffix(fullPath);
    fullPath += path;
    cmSystemTools::MakeDirectory(fullPath.c_str());
  }
}